

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_elements_transaction.cpp
# Opt level: O2

ConfidentialTxOutReference * __thiscall
cfd::ConfidentialTransactionController::AddTxOut
          (ConfidentialTxOutReference *__return_storage_ptr__,
          ConfidentialTransactionController *this,ElementsConfidentialAddress *address,Amount *value
          ,ConfidentialAssetId *asset,bool remove_nonce)

{
  ByteData nonce;
  ByteData hash_data;
  Script locking_script;
  ElementsConfidentialAddress confidential_addr;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_280;
  string local_268;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_248;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_230;
  Script local_218;
  ElementsConfidentialAddress local_1e0;
  
  core::ElementsConfidentialAddress::GetHash((ByteData *)&local_230,address);
  core::ElementsConfidentialAddress::GetLockingScript(&local_218,address);
  core::ByteData::ByteData((ByteData *)&local_280);
  if (!remove_nonce) {
    core::ElementsConfidentialAddress::GetAddress_abi_cxx11_(&local_268,address);
    core::ElementsConfidentialAddress::ElementsConfidentialAddress(&local_1e0,&local_268);
    std::__cxx11::string::~string((string *)&local_268);
    core::ElementsConfidentialAddress::GetConfidentialKey((ConfidentialKey *)&local_248,&local_1e0);
    core::Pubkey::GetData((ByteData *)&local_268,(Pubkey *)&local_248);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_280,&local_268);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_268);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_248);
    core::ElementsConfidentialAddress::~ElementsConfidentialAddress(&local_1e0);
  }
  core::ConfidentialNonce::ConfidentialNonce((ConfidentialNonce *)&local_1e0,(ByteData *)&local_280)
  ;
  AddTxOut(__return_storage_ptr__,this,&local_218,value,asset,(ConfidentialNonce *)&local_1e0);
  core::ConfidentialNonce::~ConfidentialNonce((ConfidentialNonce *)&local_1e0);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_280);
  core::Script::~Script(&local_218);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_230);
  return __return_storage_ptr__;
}

Assistant:

const ConfidentialTxOutReference ConfidentialTransactionController::AddTxOut(
    const ElementsConfidentialAddress& address, const Amount& value,
    const ConfidentialAssetId& asset, bool remove_nonce) {
  const ByteData hash_data = address.GetHash();
  Script locking_script = address.GetLockingScript();

  ByteData nonce;
  if (!remove_nonce) {
    ElementsConfidentialAddress confidential_addr(address.GetAddress());
    nonce = confidential_addr.GetConfidentialKey().GetData();
  }
  return AddTxOut(locking_script, value, asset, ConfidentialNonce(nonce));
}